

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O3

void setup_rel32(gen_ctx_t gen_ctx,label_ref_t *lr,uint8_t *base,void *addr)

{
  c2m_ctx_t c2m_ctx;
  VARR_void_ptr_t *pVVar1;
  void_ptr_t *ppvVar2;
  MIR_context_t pMVar3;
  char *message;
  _func_void_tab_str_t_void_ptr *in_R8;
  void *in_R9;
  str_t sVar4;
  int32_t rel32;
  uint8_t local_4 [4];
  
  pMVar3 = (MIR_context_t)((long)addr - (long)(base + lr->next_insn_disp));
  if ((lr->abs_addr_p == '\0') &&
     ((ulong)&pMVar3[0x750750].environment_module.last_temp_item_num >> 0x20 == 0)) {
    _MIR_change_code((MIR_context_t)gen_ctx,base + lr->label_val_disp,local_4,4);
    return;
  }
  setup_rel32_cold_1();
  c2m_ctx = (c2m_ctx_t)c2mir_calloc((c2m_ctx_t)0x0,0x208);
  message = &DAT_00000018;
  pMVar3->c2mir_ctx = (c2mir_ctx *)c2m_ctx;
  c2m_ctx->ctx = pMVar3;
  pVVar1 = (VARR_void_ptr_t *)malloc(0x18);
  c2m_ctx->reg_memory = pVVar1;
  if (pVVar1 != (VARR_void_ptr_t *)0x0) {
    pVVar1->els_num = 0;
    pVVar1->size = 0x1000;
    ppvVar2 = (void_ptr_t *)malloc(0x8000);
    pVVar1->varr = ppvVar2;
    HTAB_tab_str_t_create(&c2m_ctx->str_tab,1000,str_hash,str_eq,in_R8,in_R9);
    HTAB_tab_str_t_create(&c2m_ctx->str_key_tab,200,str_key_hash,str_key_eq,in_R8,in_R9);
    sVar4 = uniq_cstr(c2m_ctx,"");
    c2m_ctx->empty_str = sVar4;
    return;
  }
  mir_varr_error(message);
}

Assistant:

static void setup_rel32 (gen_ctx_t gen_ctx, label_ref_t *lr, uint8_t *base, void *addr) {
  MIR_context_t ctx = gen_ctx->ctx;
  int64_t offset = (int64_t) addr - (int64_t) (base + lr->next_insn_disp);
  int32_t rel32 = (int32_t) offset;

  if (lr->abs_addr_p || !(INT32_MIN <= offset && offset <= INT32_MAX)) {
    fprintf (stderr, "too big offset (%lld) in setup_rel32", (long long) offset);
    exit (1);
  }
  _MIR_change_code (ctx, (uint8_t *) base + lr->label_val_disp, (uint8_t *) &rel32, 4);
}